

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  initializer_list<unsigned_char> __l;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  size_type sVar5;
  ostream *poVar6;
  pointer pPVar7;
  unsigned_long *puVar8;
  pointer pAVar9;
  reference this;
  pointer pSVar10;
  byte *pbVar11;
  ulong uVar12;
  reference this_00;
  reference pvVar13;
  pointer pSVar14;
  string local_410;
  reference local_3f0;
  unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *it_3;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headers;
  string local_3b0 [8];
  string name;
  undefined1 local_388 [4];
  uint32_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  msa;
  string consensus;
  uchar *it_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1_2;
  invalid_argument *exception_3;
  invalid_argument *exception_4;
  undefined1 local_308 [8];
  Alignment alignment_rev;
  int32_t score_rev;
  invalid_argument *exception_2;
  undefined1 local_2c8 [8];
  Alignment alignment;
  int32_t score;
  unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *it_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  *__range1_1;
  vector<bool,_std::allocator<bool>_> is_reversed;
  Graph graph;
  invalid_argument *exception_1;
  reference local_1a0;
  unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *it;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  *__range1;
  size_t max_sequence_len;
  undefined1 local_160 [8];
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  sequences;
  invalid_argument *exception;
  unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_> local_138;
  unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_> alignment_engine;
  string local_128;
  unique_ptr<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
  local_108;
  unique_ptr<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
  sparser;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f8;
  const_iterator local_f0;
  int local_e4;
  string local_e0 [36];
  int local_bc;
  int local_b8;
  allocator<char> local_b1;
  int opt;
  string optstr;
  undefined1 local_88 [7];
  bool is_strand_ambiguous;
  string dot_path;
  allocator<unsigned_char> local_52;
  uchar local_51;
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> results;
  int8_t local_1e;
  uint8_t algorithm;
  int32_t min_coverage;
  int8_t c;
  int8_t q;
  int8_t e;
  int8_t g;
  int8_t n;
  int8_t m;
  char **argv_local;
  int argc_local;
  
  min_coverage._3_1_ = '\x05';
  min_coverage._2_1_ = -4;
  min_coverage._1_1_ = -8;
  min_coverage._0_1_ = -6;
  algorithm = 0xf6;
  local_1e = -4;
  results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = -1;
  results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  local_51 = '\0';
  local_50 = &local_51;
  local_48 = 1;
  std::allocator<unsigned_char>::allocator(&local_52);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,__l,&local_52);
  std::allocator<unsigned_char>::~allocator(&local_52);
  std::__cxx11::string::string((string *)local_88);
  optstr.field_2._M_local_buf[0xf] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&opt,"m:n:g:e:q:c:l:r:d:sh",&local_b1);
  std::allocator<char>::~allocator(&local_b1);
  while( true ) {
    uVar4 = std::__cxx11::string::c_str();
    local_b8 = getopt_long(argc,argv,uVar4,(anonymous_namespace)::options,0);
    if (local_b8 == -1) break;
    switch(local_b8) {
    case 0x4d:
      results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = atoi(_optarg);
      break;
    default:
      argv_local._4_4_ = 1;
      local_e4 = 1;
      goto LAB_001049b1;
    case 99:
      iVar2 = atoi(_optarg);
      local_1e = (int8_t)iVar2;
      break;
    case 100:
      std::__cxx11::string::operator=((string *)local_88,_optarg);
      break;
    case 0x65:
      iVar2 = atoi(_optarg);
      min_coverage._0_1_ = (int8_t)iVar2;
      break;
    case 0x67:
      iVar2 = atoi(_optarg);
      min_coverage._1_1_ = (int8_t)iVar2;
      break;
    case 0x68:
      anon_unknown.dwarf_10c6c::Help();
      argv_local._4_4_ = 0;
      local_e4 = 1;
      goto LAB_001049b1;
    case 0x6c:
      iVar2 = atoi(_optarg);
      results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = (byte)iVar2;
      break;
    case 0x6d:
      iVar2 = atoi(_optarg);
      min_coverage._3_1_ = (int8_t)iVar2;
      break;
    case 0x6e:
      iVar2 = atoi(_optarg);
      min_coverage._2_1_ = (int8_t)iVar2;
      break;
    case 0x71:
      iVar2 = atoi(_optarg);
      algorithm = (uint8_t)iVar2;
      break;
    case 0x72:
      local_bc = atoi(_optarg);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<int>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,&local_bc);
      break;
    case 0x73:
      optstr.field_2._M_local_buf[0xf] = '\x01';
      break;
    case 0x76:
      spoa::Version_abi_cxx11_();
      poVar6 = std::operator<<((ostream *)&std::cout,local_e0);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_e0);
      argv_local._4_4_ = 0;
      local_e4 = 1;
      goto LAB_001049b1;
    }
  }
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  if (1 < sVar5) {
    local_f8._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_f0,&local_f8);
    sparser._M_t.
    super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
    .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl =
         (__uniq_ptr_data<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>,_true,_true>
          )std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,local_f0);
  }
  if (_optind < argc) {
    __s = argv[_optind];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,__s,
               (allocator<char> *)
               ((long)&alignment_engine._M_t.
                       super___uniq_ptr_impl<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spoa::AlignmentEngine_*,_std::default_delete<spoa::AlignmentEngine>_>
                       .super__Head_base<0UL,_spoa::AlignmentEngine_*,_false>._M_head_impl + 7));
    anon_unknown.dwarf_10c6c::CreateParser((anon_unknown_dwarf_10c6c *)&local_108,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&alignment_engine._M_t.
                       super___uniq_ptr_impl<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spoa::AlignmentEngine_*,_std::default_delete<spoa::AlignmentEngine>_>
                       .super__Head_base<0UL,_spoa::AlignmentEngine_*,_false>._M_head_impl + 7));
    bVar1 = std::operator==(&local_108,(nullptr_t)0x0);
    if (bVar1) {
      argv_local._4_4_ = 1;
      local_e4 = 1;
    }
    else {
      std::unique_ptr<spoa::AlignmentEngine,std::default_delete<spoa::AlignmentEngine>>::
      unique_ptr<std::default_delete<spoa::AlignmentEngine>,void>
                ((unique_ptr<spoa::AlignmentEngine,std::default_delete<spoa::AlignmentEngine>> *)
                 &local_138);
      spoa::AlignmentEngine::Create
                ((AlignmentEngine *)&exception,
                 (uint)results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_,min_coverage._3_1_,
                 min_coverage._2_1_,min_coverage._1_1_,(int8_t)min_coverage,algorithm,local_1e);
      std::unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>::operator=
                (&local_138,
                 (unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_> *)
                 &exception);
      std::unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>::
      ~unique_ptr((unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_> *)
                  &exception);
      std::
      vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
      ::vector((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                *)local_160);
      pPVar7 = std::
               unique_ptr<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
               ::operator->(&local_108);
      (*pPVar7->_vptr_Parser[2])(&max_sequence_len,pPVar7,0xffffffffffffffff,1);
      std::
      vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
      ::operator=((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                   *)local_160,
                  (vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                   *)&max_sequence_len);
      std::
      vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
      ::~vector((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                 *)&max_sequence_len);
      __range1 = (vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                  *)0x0;
      __end1 = std::
               vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
               ::begin((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                        *)local_160);
      it = (unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *)
           std::
           vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
           ::end((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                  *)local_160);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>
                                         *)&it), bVar1) {
        local_1a0 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>
                    ::operator*(&__end1);
        std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>::operator->
                  (local_1a0);
        exception_1 = (invalid_argument *)std::__cxx11::string::size();
        puVar8 = std::max<unsigned_long>((unsigned_long *)&__range1,(unsigned_long *)&exception_1);
        __range1 = (vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                    *)*puVar8;
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>
        ::operator++(&__end1);
      }
      pAVar9 = std::unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>::
               operator->(&local_138);
      (*pAVar9->_vptr_AlignmentEngine[2])(pAVar9,(ulong)__range1 & 0xffffffff,4);
      spoa::Graph::Graph((Graph *)&is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_end_of_storage);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&__range1_1);
      __end1_1 = std::
                 vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                 ::begin((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                          *)local_160);
      it_1 = (unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *)
             std::
             vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
             ::end((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                    *)local_160);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>
                                 *)&it_1), bVar1) {
        this = __gnu_cxx::
               __normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>
               ::operator*(&__end1_1);
        alignment.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_2c8);
        pAVar9 = std::unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>
                 ::operator->(&local_138);
        pSVar14 = std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>::
                  operator->(this);
        spoa::AlignmentEngine::Align
                  ((Alignment *)&exception_2,pAVar9,&pSVar14->data,
                   (Graph *)&is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage,
                   (int32_t *)
                   ((long)&alignment.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_2c8,
                   (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &exception_2);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &exception_2);
        if ((optstr.field_2._M_local_buf[0xf] & 1U) == 0) {
LAB_0010428d:
          std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>::operator->
                    (this);
          uVar12 = std::__cxx11::string::empty();
          if ((uVar12 & 1) == 0) {
            pSVar14 = std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>::
                      operator->(this);
            pSVar10 = std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>::
                      operator->(this);
            spoa::Graph::AddAlignment
                      ((Graph *)&is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_end_of_storage,(Alignment *)local_2c8,
                       &pSVar14->data,&pSVar10->quality);
          }
          else {
            pSVar14 = std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>::
                      operator->(this);
            spoa::Graph::AddAlignment
                      ((Graph *)&is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_end_of_storage,(Alignment *)local_2c8,
                       &pSVar14->data,1);
          }
          local_e4 = 0;
        }
        else {
          pSVar14 = std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>::
                    operator->(this);
          biosoup::Sequence::ReverseAndComplement(pSVar14);
          alignment_rev.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_308
                    );
          pAVar9 = std::
                   unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>::
                   operator->(&local_138);
          pSVar14 = std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>::
                    operator->(this);
          spoa::AlignmentEngine::Align
                    ((Alignment *)&exception_4,pAVar9,&pSVar14->data,
                     (Graph *)&is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage,
                     (int32_t *)
                     ((long)&alignment_rev.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_308
                     ,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      &exception_4);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     &exception_4);
          if (alignment.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage._4_4_ <
              alignment_rev.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage._4_4_) {
            std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       local_2c8,
                       (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       local_308);
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)&__range1_1,true);
          }
          else {
            pSVar14 = std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>::
                      operator->(this);
            biosoup::Sequence::ReverseAndComplement(pSVar14);
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)&__range1_1,false);
          }
          local_e4 = 0;
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_308
                    );
          if (local_e4 == 0) goto LAB_0010428d;
        }
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_2c8);
        if (local_e4 != 0) goto LAB_0010492d;
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>
        ::operator++(&__end1_1);
      }
      __end1_2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
      it_2 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_2,
                                (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)&it_2), bVar1) {
        pbVar11 = __gnu_cxx::
                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator*(&__end1_2);
        uVar3 = (uint)*pbVar11;
        if (uVar3 == 0) {
          spoa::Graph::GenerateConsensus_abi_cxx11_
                    ((string *)
                     &msa.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (Graph *)&is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage,
                     results.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          poVar6 = std::operator<<((ostream *)&std::cout,">Consensus LN:i:");
          uVar12 = std::__cxx11::string::size();
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar12);
          poVar6 = (ostream *)
                   std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          poVar6 = std::operator<<(poVar6,(string *)
                                          &msa.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          local_e4 = 0xb;
          std::__cxx11::string::~string
                    ((string *)
                     &msa.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if (uVar3 - 1 < 2) {
          spoa::Graph::GenerateMultipleSequenceAlignment_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_388,
                     (Graph *)&is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage,*pbVar11 == 2);
          for (name.field_2._12_4_ = 0; uVar12 = (ulong)(uint)name.field_2._12_4_,
              sVar5 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_388), uVar12 < sVar5;
              name.field_2._12_4_ = name.field_2._12_4_ + 1) {
            uVar12 = (ulong)(uint)name.field_2._12_4_;
            sVar5 = std::
                    vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                    ::size((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                            *)local_160);
            headers.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
            if (uVar12 < sVar5) {
              this_00 = std::
                        vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                        ::operator[]((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                                      *)local_160,(ulong)(uint)name.field_2._12_4_);
              pSVar14 = std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>
                        ::operator->(this_00);
              std::__cxx11::string::string(local_3b0,(string *)&pSVar14->name);
            }
            else {
              std::allocator<char>::allocator();
              headers.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_3b0,"Consensus",
                         (allocator<char> *)
                         ((long)&headers.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            }
            if ((headers.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&headers.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            }
            poVar6 = std::operator<<((ostream *)&std::cout,">");
            poVar6 = std::operator<<(poVar6,local_3b0);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pvVar13 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_388,(ulong)(uint)name.field_2._12_4_);
            poVar6 = std::operator<<(poVar6,(string *)pvVar13);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_3b0);
          }
          local_e4 = 0xb;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_388);
        }
        else if (uVar3 - 3 < 2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range3);
          __end3 = std::
                   vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                   ::begin((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                            *)local_160);
          it_3 = (unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_> *)
                 std::
                 vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                 ::end((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                        *)local_160);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>
                                             *)&it_3), bVar1) {
            local_3f0 = __gnu_cxx::
                        __normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>
                        ::operator*(&__end3);
            pSVar14 = std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>::
                      operator->(local_3f0);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &__range3,&pSVar14->name);
            __gnu_cxx::
            __normal_iterator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_*,_std::vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>_>
            ::operator++(&__end3);
          }
          spoa::Graph::GenerateConsensus_abi_cxx11_
                    (&local_410,
                     (Graph *)&is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string((string *)&local_410);
          anon_unknown.dwarf_10c6c::PrintGfa
                    ((Graph *)&is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range3,(vector<bool,_std::allocator<bool>_> *)&__range1_1,*pbVar11 == 4);
          local_e4 = 0xb;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range3);
        }
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator++(&__end1_2);
      }
      spoa::Graph::PrintDot
                ((Graph *)&is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage,(string *)local_88);
      local_e4 = 1;
LAB_0010492d:
      argv_local._4_4_ = 0;
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)&__range1_1);
      spoa::Graph::~Graph((Graph *)&is_reversed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_end_of_storage);
      std::
      vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
      ::~vector((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                 *)local_160);
      std::unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>::
      ~unique_ptr(&local_138);
    }
    std::
    unique_ptr<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
    ::~unique_ptr(&local_108);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"[spoa::] error: missing input file!");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    anon_unknown.dwarf_10c6c::Help();
    argv_local._4_4_ = 1;
    local_e4 = 1;
  }
LAB_001049b1:
  std::__cxx11::string::~string((string *)&opt);
  std::__cxx11::string::~string((string *)local_88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  std::int8_t m = 5;
  std::int8_t n = -4;
  std::int8_t g = -8;
  std::int8_t e = -6;
  std::int8_t q = -10;
  std::int8_t c = -4;

  std::int32_t min_coverage = -1;

  std::uint8_t algorithm = 0;
  std::vector<std::uint8_t> results = { 0 };
  std::string dot_path{};
  bool is_strand_ambiguous = false;

  std::string optstr = "m:n:g:e:q:c:l:r:d:sh";
  int opt;
  while ((opt = getopt_long(argc, argv, optstr.c_str(), options, nullptr)) != -1) {  // NOLINT
    switch (opt) {
      case 'm': m = atoi(optarg); break;
      case 'n': n = atoi(optarg); break;
      case 'g': g = atoi(optarg); break;
      case 'e': e = atoi(optarg); break;
      case 'q': q = atoi(optarg); break;
      case 'c': c = atoi(optarg); break;
      case 'M': min_coverage = atoi(optarg); break;
      case 'l': algorithm = atoi(optarg); break;
      case 'r': results.emplace_back(atoi(optarg)); break;
      case 'd': dot_path = optarg; break;
      case 's': is_strand_ambiguous = true; break;
      case 'v': std::cout << spoa::Version() << std::endl; return 0;
      case 'h': Help(); return 0;
      default: return 1;
    }
  }
  if (results.size() > 1) {
    results.erase(results.begin());
  }

  if (optind >= argc) {
    std::cerr << "[spoa::] error: missing input file!" << std::endl;
    Help();
    return 1;
  }

  auto sparser = CreateParser(argv[optind]);
  if (sparser == nullptr) {
    return 1;
  }

  std::unique_ptr<spoa::AlignmentEngine> alignment_engine;
  try {
    alignment_engine = spoa::AlignmentEngine::Create(
        static_cast<spoa::AlignmentType>(algorithm), m, n, g, e, q, c);
  } catch(std::invalid_argument& exception) {
    std::cerr << exception.what() << std::endl;
    return 1;
  }

  std::vector<std::unique_ptr<biosoup::Sequence>> sequences;
  sequences = sparser->Parse(-1);

  std::size_t max_sequence_len = 0;
  for (const auto& it : sequences) {
    max_sequence_len = std::max(max_sequence_len, it->data.size());
  }
  try {
    alignment_engine->Prealloc(max_sequence_len, 4);
  } catch (std::invalid_argument& exception) {
    std::cerr << exception.what() << std::endl;
    return 1;
  }

  spoa::Graph graph{};
  std::vector<bool> is_reversed;
  for (const auto& it : sequences) {
    std::int32_t score = 0;
    spoa::Alignment alignment;
    try {
      alignment = alignment_engine->Align(it->data, graph, &score);
    } catch (std::invalid_argument& exception) {
      std::cerr << exception.what() << std::endl;
      return 1;
    }

    if (is_strand_ambiguous) {
      it->ReverseAndComplement();
      std::int32_t score_rev = 0;
      spoa::Alignment alignment_rev;
      try {
        alignment_rev = alignment_engine->Align(it->data, graph, &score_rev);
      } catch (std::invalid_argument& exception) {
        std::cerr << exception.what() << std::endl;
        return 1;
      }
      if (score >= score_rev) {
        it->ReverseAndComplement();
        is_reversed.push_back(false);
      } else {
        alignment = alignment_rev;
        is_reversed.push_back(true);
      }
    }

    try {
      if (it->quality.empty()) {
        graph.AddAlignment(alignment, it->data);
      } else {
        graph.AddAlignment(alignment, it->data, it->quality);
      }
    } catch(std::invalid_argument& exception) {
      std::cerr << exception.what() << std::endl;
      return 1;
    }
  }

  for (const auto& it : results) {
    switch (it) {
      case 0: {
        auto consensus = graph.GenerateConsensus(min_coverage);
        std::cout << ">Consensus LN:i:" << consensus.size() << std::endl
                  << consensus << std::endl;
        break;
      }
      case 1:
      case 2: {
        auto msa = graph.GenerateMultipleSequenceAlignment(it == 2);
        for (std::uint32_t i = 0; i < msa.size(); ++i) {
          std::string name = i < sequences.size() ? sequences[i]->name : "Consensus";  // NOLINT
          std::cout << ">" << name << std::endl
                    << msa[i] << std::endl;
        }
        break;
      }
      case 3:
      case 4: {
        std::vector<std::string> headers;
        for (const auto& it : sequences) {
          headers.emplace_back(it->name);
        }
        graph.GenerateConsensus();
        PrintGfa(graph, headers, is_reversed, it == 4);
        break;
      }
      default:
        break;
    }
  }

  graph.PrintDot(dot_path);

  return 0;
}